

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilSort.c
# Opt level: O0

void Abc_QuickSort2(word *pData,int nSize,int fDecrease)

{
  int fVerify;
  int i;
  int fDecrease_local;
  int nSize_local;
  word *pData_local;
  
  if (fDecrease == 0) {
    Abc_QuickSort2Inc_rec(pData,0,nSize + -1);
  }
  else {
    Abc_QuickSort2Dec_rec(pData,0,nSize + -1);
  }
  return;
}

Assistant:

void Abc_QuickSort2( word * pData, int nSize, int fDecrease )
{
    int i, fVerify = 0;
    if ( fDecrease )
    {
        Abc_QuickSort2Dec_rec( pData, 0, nSize - 1 );
        if ( fVerify )
            for ( i = 1; i < nSize; i++ )
                assert( (unsigned)pData[i-1] >= (unsigned)pData[i] );
    }
    else
    {
        Abc_QuickSort2Inc_rec( pData, 0, nSize - 1 );
        if ( fVerify )
            for ( i = 1; i < nSize; i++ )
                assert( (unsigned)pData[i-1] <= (unsigned)pData[i] );
    }
}